

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O1

EVP_PKEY * EVP_PKCS82PKEY(PKCS8_PRIV_KEY_INFO *p8)

{
  uint uVar1;
  EVP_PKEY *pkey;
  uint8_t *der;
  CBS cbs;
  uchar *local_20;
  CBS local_18;
  
  local_20 = (uchar *)0x0;
  uVar1 = ASN1_item_i2d((ASN1_VALUE *)p8,&local_20,(ASN1_ITEM *)&PKCS8_PRIV_KEY_INFO_it);
  if ((int)uVar1 < 0) {
    pkey = (EVP_PKEY *)0x0;
  }
  else {
    local_18.len = (size_t)uVar1;
    local_18.data = local_20;
    pkey = (EVP_PKEY *)EVP_parse_private_key(&local_18);
    if ((pkey == (EVP_PKEY *)0x0) || (local_18.len != 0)) {
      ERR_put_error(0x13,0,0x68,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                    ,0x4a);
      EVP_PKEY_free(pkey);
      pkey = (EVP_PKEY *)0x0;
    }
    OPENSSL_free(local_20);
  }
  return pkey;
}

Assistant:

EVP_PKEY *EVP_PKCS82PKEY(const PKCS8_PRIV_KEY_INFO *p8) {
  uint8_t *der = NULL;
  int der_len = i2d_PKCS8_PRIV_KEY_INFO(p8, &der);
  if (der_len < 0) {
    return NULL;
  }

  CBS cbs;
  CBS_init(&cbs, der, (size_t)der_len);
  EVP_PKEY *ret = EVP_parse_private_key(&cbs);
  if (ret == NULL || CBS_len(&cbs) != 0) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
    EVP_PKEY_free(ret);
    OPENSSL_free(der);
    return NULL;
  }

  OPENSSL_free(der);
  return ret;
}